

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O2

MemoryReportFormatter * __thiscall
MemoryReporterPluginUnderTest::createMemoryFormatter
          (MemoryReporterPluginUnderTest *this,SimpleString *type)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  char *pcVar4;
  MemoryReportFormatter *pMVar5;
  SimpleString SStack_48;
  SimpleString local_38;
  SimpleString local_28;
  
  SimpleString::SimpleString(&local_28,"reporter");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_38,"createMemoryFormatter");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_38);
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x170))
                             ((long *)CONCAT44(extraout_var,iVar1),this);
  SimpleString::SimpleString(&SStack_48,"type");
  pcVar4 = SimpleString::asCharString(type);
  (**(code **)(*plVar3 + 0x78))(plVar3,&SStack_48,pcVar4);
  SimpleString::~SimpleString(&SStack_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  pMVar5 = (MemoryReportFormatter *)
           operator_new(8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MemoryReporterPluginTest.cpp"
                        ,100);
  pMVar5->_vptr_MemoryReportFormatter = (_func_int **)&PTR__MemoryReportFormatter_002b7e28;
  return pMVar5;
}

Assistant:

MemoryReportFormatter* createMemoryFormatter(const SimpleString& type) _override
    {
        mock("reporter").actualCall("createMemoryFormatter").onObject(this).withParameter("type", type.asCharString());
        return new MockMemoryReportFormatter;
    }